

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEnc_CodeOneBlock(CLzmaEnc *p,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  byte bVar1;
  ushort uVar2;
  CLzmaEnc *pCVar3;
  UInt32 UVar4;
  SRes SVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  Byte *pBVar12;
  byte *pbVar13;
  CLzmaProb *pCVar14;
  byte bVar15;
  uint local_cc;
  UInt32 processed;
  UInt32 mask_4;
  UInt32 mask_3;
  UInt32 mask_2;
  UInt32 mask_1;
  uint bit_1;
  uint m;
  UInt32 pos2;
  uint base;
  uint footerBits;
  UInt32 mask;
  UInt32 bit;
  CLzmaProb *prob;
  UInt32 sym;
  uint zz;
  uint posSlot;
  uint state;
  Byte *data;
  Byte curByte_1;
  COptimal *opt;
  uint oci;
  CLzmaProb *probs;
  UInt32 newBound;
  UInt32 ttt;
  UInt32 range;
  uint posState;
  uint len;
  UInt32 dist;
  SRes SStack_2c;
  Byte curByte;
  uint numPairs;
  int _result_;
  UInt32 startPos32;
  UInt32 nowPos32;
  UInt32 maxUnpackSize_local;
  UInt32 maxPackSize_local;
  CLzmaEnc *p_local;
  
  startPos32 = maxUnpackSize;
  nowPos32 = maxPackSize;
  _maxUnpackSize_local = p;
  if (p->needInit != 0) {
    (*(p->matchFinder).Init)(p->matchFinderObj);
    _maxUnpackSize_local->needInit = 0;
  }
  if (_maxUnpackSize_local->finished == 0) {
    SStack_2c = CheckErrors(_maxUnpackSize_local);
    p_local._4_4_ = SStack_2c;
    if (SStack_2c == 0) {
      numPairs = (uint)_maxUnpackSize_local->nowPos64;
      _result_ = numPairs;
      if (_maxUnpackSize_local->nowPos64 == 0) {
        UVar4 = (*(_maxUnpackSize_local->matchFinder).GetNumAvailableBytes)
                          (_maxUnpackSize_local->matchFinderObj);
        if (UVar4 == 0) {
          SVar5 = Flush(_maxUnpackSize_local,_result_);
          return SVar5;
        }
        ReadMatchDistances(_maxUnpackSize_local,&dist);
        RangeEnc_EncodeBit_0(&_maxUnpackSize_local->rc,_maxUnpackSize_local->isMatch[0]);
        pBVar12 = (*(_maxUnpackSize_local->matchFinder).GetPointerToCurrentPos)
                            (_maxUnpackSize_local->matchFinderObj);
        LitEnc_Encode(&_maxUnpackSize_local->rc,_maxUnpackSize_local->litProbs,
                      (uint)pBVar12[-(ulong)_maxUnpackSize_local->additionalOffset]);
        _maxUnpackSize_local->additionalOffset = _maxUnpackSize_local->additionalOffset - 1;
        _result_ = _result_ + 1;
      }
      UVar4 = (*(_maxUnpackSize_local->matchFinder).GetNumAvailableBytes)
                        (_maxUnpackSize_local->matchFinderObj);
      if (UVar4 == 0) {
LAB_001d397a:
        _maxUnpackSize_local->nowPos64 =
             (ulong)(_result_ - numPairs) + _maxUnpackSize_local->nowPos64;
        p_local._4_4_ = Flush(_maxUnpackSize_local,_result_);
      }
      else {
        do {
          while( true ) {
            do {
              if (_maxUnpackSize_local->fastMode == 0) {
                uVar8 = _maxUnpackSize_local->optCur;
                if (_maxUnpackSize_local->optEnd == uVar8) {
                  range = GetOptimum(_maxUnpackSize_local,_result_);
                }
                else {
                  range = _maxUnpackSize_local->opt[uVar8].len;
                  _maxUnpackSize_local->backRes = _maxUnpackSize_local->opt[uVar8].dist;
                  _maxUnpackSize_local->optCur = uVar8 + 1;
                }
              }
              else {
                range = GetOptimumFast(_maxUnpackSize_local);
              }
              uVar6 = _result_ & _maxUnpackSize_local->pbMask;
              uVar8 = (_maxUnpackSize_local->rc).range;
              pCVar14 = _maxUnpackSize_local->isMatch[_maxUnpackSize_local->state] + uVar6;
              uVar2 = *pCVar14;
              uVar7 = (uVar8 >> 0xb) * (uint)uVar2;
              uVar11 = _maxUnpackSize_local->backRes;
              if (uVar11 == 0xffffffff) {
                *pCVar14 = uVar2 + (short)(0x800 - uVar2 >> 5);
                newBound = uVar7;
                if (uVar7 < 0x1000000) {
                  newBound = uVar7 * 0x100;
                  RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                }
                (_maxUnpackSize_local->rc).range = newBound;
                pBVar12 = (*(_maxUnpackSize_local->matchFinder).GetPointerToCurrentPos)
                                    (_maxUnpackSize_local->matchFinderObj);
                pbVar13 = pBVar12 + -(ulong)_maxUnpackSize_local->additionalOffset;
                bVar15 = pbVar13[-1];
                bVar1 = *pbVar13;
                uVar8 = _maxUnpackSize_local->state;
                _maxUnpackSize_local->state = (uint)""[uVar8];
                if (uVar8 < 7) {
                  LitEnc_Encode(&_maxUnpackSize_local->rc,
                                _maxUnpackSize_local->litProbs +
                                ((_result_ * 0x100 + (uint)bVar15 & _maxUnpackSize_local->lpMask) <<
                                ((byte)_maxUnpackSize_local->lc & 0x1f)) * 3,(uint)bVar1);
                }
                else {
                  LitEnc_EncodeMatched
                            (&_maxUnpackSize_local->rc,
                             _maxUnpackSize_local->litProbs +
                             ((_result_ * 0x100 + (uint)bVar15 & _maxUnpackSize_local->lpMask) <<
                             ((byte)_maxUnpackSize_local->lc & 0x1f)) * 3,(uint)bVar1,
                             (uint)pbVar13[-(ulong)_maxUnpackSize_local->reps[0]]);
                }
              }
              else {
                newBound = uVar8 - uVar7;
                (_maxUnpackSize_local->rc).low = (ulong)uVar7 + (_maxUnpackSize_local->rc).low;
                *pCVar14 = uVar2 - (uVar2 >> 5);
                if (newBound < 0x1000000) {
                  newBound = newBound * 0x100;
                  RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                }
                pCVar14 = _maxUnpackSize_local->isRep + _maxUnpackSize_local->state;
                uVar2 = *pCVar14;
                uVar8 = (newBound >> 0xb) * (uint)uVar2;
                if (uVar11 < 4) {
                  newBound = newBound - uVar8;
                  (_maxUnpackSize_local->rc).low = (ulong)uVar8 + (_maxUnpackSize_local->rc).low;
                  *pCVar14 = uVar2 - (uVar2 >> 5);
                  if (newBound < 0x1000000) {
                    newBound = newBound * 0x100;
                    RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                  }
                  pCVar14 = _maxUnpackSize_local->isRepG0 + _maxUnpackSize_local->state;
                  uVar2 = *pCVar14;
                  uVar8 = (newBound >> 0xb) * (uint)uVar2;
                  if (uVar11 == 0) {
                    *pCVar14 = uVar2 + (short)(0x800 - uVar2 >> 5);
                    newBound = uVar8;
                    if (uVar8 < 0x1000000) {
                      newBound = uVar8 * 0x100;
                      RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                    }
                    pCVar14 = _maxUnpackSize_local->isRep0Long[_maxUnpackSize_local->state] + uVar6;
                    uVar2 = *pCVar14;
                    uVar8 = (newBound >> 0xb) * (uint)uVar2;
                    if (range == 1) {
                      *pCVar14 = uVar2 + (short)(0x800 - uVar2 >> 5);
                      _maxUnpackSize_local->state =
                           (uint)"\t\t\t\t\t\t\t\v\v\v\v\v"[_maxUnpackSize_local->state];
                      newBound = uVar8;
                    }
                    else {
                      (_maxUnpackSize_local->rc).low = (ulong)uVar8 + (_maxUnpackSize_local->rc).low
                      ;
                      *pCVar14 = uVar2 - (uVar2 >> 5);
                      newBound = newBound - uVar8;
                    }
                  }
                  else {
                    newBound = newBound - uVar8;
                    (_maxUnpackSize_local->rc).low = (ulong)uVar8 + (_maxUnpackSize_local->rc).low;
                    *pCVar14 = uVar2 - (uVar2 >> 5);
                    if (newBound < 0x1000000) {
                      newBound = newBound * 0x100;
                      RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                    }
                    pCVar14 = _maxUnpackSize_local->isRepG1 + _maxUnpackSize_local->state;
                    uVar2 = *pCVar14;
                    uVar8 = (newBound >> 0xb) * (uint)uVar2;
                    if (uVar11 == 1) {
                      *pCVar14 = uVar2 + (short)(0x800 - uVar2 >> 5);
                      posState = _maxUnpackSize_local->reps[1];
                      newBound = uVar8;
                    }
                    else {
                      newBound = newBound - uVar8;
                      (_maxUnpackSize_local->rc).low = (ulong)uVar8 + (_maxUnpackSize_local->rc).low
                      ;
                      *pCVar14 = uVar2 - (uVar2 >> 5);
                      if (newBound < 0x1000000) {
                        newBound = newBound * 0x100;
                        RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                      }
                      pCVar14 = _maxUnpackSize_local->isRepG2 + _maxUnpackSize_local->state;
                      uVar2 = *pCVar14;
                      uVar8 = (newBound >> 0xb) * (uint)uVar2;
                      if (uVar11 == 2) {
                        *pCVar14 = uVar2 + (short)(0x800 - uVar2 >> 5);
                        posState = _maxUnpackSize_local->reps[2];
                        newBound = uVar8;
                      }
                      else {
                        newBound = newBound - uVar8;
                        (_maxUnpackSize_local->rc).low =
                             (ulong)uVar8 + (_maxUnpackSize_local->rc).low;
                        *pCVar14 = uVar2 - (uVar2 >> 5);
                        posState = _maxUnpackSize_local->reps[3];
                        _maxUnpackSize_local->reps[3] = _maxUnpackSize_local->reps[2];
                      }
                      _maxUnpackSize_local->reps[2] = _maxUnpackSize_local->reps[1];
                    }
                    _maxUnpackSize_local->reps[1] = _maxUnpackSize_local->reps[0];
                    _maxUnpackSize_local->reps[0] = posState;
                  }
                  if (newBound < 0x1000000) {
                    newBound = newBound << 8;
                    RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                  }
                  (_maxUnpackSize_local->rc).range = newBound;
                  if (range != 1) {
                    LenEnc_Encode(&_maxUnpackSize_local->repLenProbs,&_maxUnpackSize_local->rc,
                                  range - 2,uVar6);
                    _maxUnpackSize_local->repLenEncCounter =
                         _maxUnpackSize_local->repLenEncCounter + -1;
                    _maxUnpackSize_local->state =
                         (uint)"\b\b\b\b\b\b\b\v\v\v\v\v"[_maxUnpackSize_local->state];
                  }
                }
                else {
                  *pCVar14 = uVar2 + (short)(0x800 - uVar2 >> 5);
                  newBound = uVar8;
                  if (uVar8 < 0x1000000) {
                    newBound = uVar8 * 0x100;
                    RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                  }
                  (_maxUnpackSize_local->rc).range = newBound;
                  _maxUnpackSize_local->state =
                       (uint)"\a\a\a\a\a\a\a\n\n\n\n\n"[_maxUnpackSize_local->state];
                  LenEnc_Encode(&_maxUnpackSize_local->lenProbs,&_maxUnpackSize_local->rc,range - 2,
                                uVar6);
                  pCVar3 = _maxUnpackSize_local;
                  uVar8 = uVar11 - 4;
                  _maxUnpackSize_local->reps[3] = _maxUnpackSize_local->reps[2];
                  _maxUnpackSize_local->reps[2] = _maxUnpackSize_local->reps[1];
                  _maxUnpackSize_local->reps[1] = _maxUnpackSize_local->reps[0];
                  _maxUnpackSize_local->reps[0] = uVar11 - 3;
                  _maxUnpackSize_local->matchPriceCount = _maxUnpackSize_local->matchPriceCount + 1;
                  if (uVar8 < 0x80) {
                    sym = (UInt32)_maxUnpackSize_local->g_FastPos[uVar8 & 0x7f];
                  }
                  else {
                    iVar9 = 0x13;
                    if (uVar8 < 0x100000) {
                      iVar9 = 6;
                    }
                    sym = (uint)_maxUnpackSize_local->g_FastPos[uVar8 >> (sbyte)iVar9] + iVar9 * 2;
                  }
                  prob._0_4_ = sym + 0x40;
                  newBound = (_maxUnpackSize_local->rc).range;
                  if (range < 5) {
                    local_cc = range - 2;
                  }
                  else {
                    local_cc = 3;
                  }
                  do {
                    pCVar14 = pCVar3->posSlotEncoder[local_cc] + ((uint)prob >> 6);
                    uVar10 = (uint)prob >> 5 & 1;
                    prob._0_4_ = (uint)prob << 1;
                    uVar2 = *pCVar14;
                    uVar6 = (newBound >> 0xb) * (uint)uVar2;
                    uVar11 = -uVar10;
                    uVar7 = uVar6 & uVar11;
                    (_maxUnpackSize_local->rc).low = (ulong)uVar7 + (_maxUnpackSize_local->rc).low;
                    uVar10 = uVar10 - 1;
                    newBound = (uVar6 & uVar10) + ((uVar11 & newBound) - uVar7);
                    *pCVar14 = (short)((int)(((uVar10 & 0x7e1) + 0x1f) - (uint)uVar2) >> 5) + uVar2;
                    if (newBound < 0x1000000) {
                      newBound = newBound * 0x100;
                      RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                    }
                  } while ((uint)prob < 0x1000);
                  (_maxUnpackSize_local->rc).range = newBound;
                  if (3 < uVar8) {
                    uVar11 = (sym >> 1) - 1;
                    bVar15 = (byte)uVar11;
                    if (uVar8 < 0x80) {
                      RcTree_ReverseEncode
                                (&_maxUnpackSize_local->rc,
                                 _maxUnpackSize_local->posEncoders +
                                 ((sym & 1 | 2) << (bVar15 & 0x1f)),uVar11,uVar8);
                    }
                    else {
                      bit_1 = (uVar8 | 0xf) << (0x20 - bVar15 & 0x1f);
                      newBound = (_maxUnpackSize_local->rc).range;
                      do {
                        newBound = newBound >> 1;
                        (_maxUnpackSize_local->rc).low =
                             (ulong)(newBound & (int)bit_1 >> 0x1f) + (_maxUnpackSize_local->rc).low
                        ;
                        bit_1 = bit_1 * 2;
                        if (newBound < 0x1000000) {
                          newBound = newBound << 8;
                          RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                        }
                      } while (bit_1 != 0xf0000000);
                      uVar7 = uVar8 & 1;
                      uVar2 = _maxUnpackSize_local->posAlignEncoder[1];
                      uVar11 = (newBound >> 0xb) * (uint)uVar2;
                      uVar6 = uVar11 & -uVar7;
                      (_maxUnpackSize_local->rc).low = (ulong)uVar6 + (_maxUnpackSize_local->rc).low
                      ;
                      newBound = (uVar11 & uVar7 - 1) + ((-uVar7 & newBound) - uVar6);
                      _maxUnpackSize_local->posAlignEncoder[1] =
                           (short)((int)(((uVar7 - 1 & 0x7e1) + 0x1f) - (uint)uVar2) >> 5) + uVar2;
                      if (newBound < 0x1000000) {
                        newBound = newBound * 0x100;
                        RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                      }
                      uVar7 = uVar7 + 2;
                      uVar10 = uVar8 >> 1 & 1;
                      uVar2 = _maxUnpackSize_local->posAlignEncoder[uVar7];
                      uVar11 = (newBound >> 0xb) * (uint)uVar2;
                      uVar6 = uVar11 & -uVar10;
                      (_maxUnpackSize_local->rc).low = (ulong)uVar6 + (_maxUnpackSize_local->rc).low
                      ;
                      newBound = (uVar11 & uVar10 - 1) + ((-uVar10 & newBound) - uVar6);
                      _maxUnpackSize_local->posAlignEncoder[uVar7] =
                           (short)((int)(((uVar10 - 1 & 0x7e1) + 0x1f) - (uint)uVar2) >> 5) + uVar2;
                      if (newBound < 0x1000000) {
                        newBound = newBound * 0x100;
                        RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                      }
                      uVar10 = uVar7 * 2 + uVar10;
                      uVar7 = uVar8 >> 2 & 1;
                      uVar2 = _maxUnpackSize_local->posAlignEncoder[uVar10];
                      uVar11 = (newBound >> 0xb) * (uint)uVar2;
                      uVar6 = uVar11 & -uVar7;
                      (_maxUnpackSize_local->rc).low = (ulong)uVar6 + (_maxUnpackSize_local->rc).low
                      ;
                      newBound = (uVar11 & uVar7 - 1) + ((-uVar7 & newBound) - uVar6);
                      _maxUnpackSize_local->posAlignEncoder[uVar10] =
                           (short)((int)(((uVar7 - 1 & 0x7e1) + 0x1f) - (uint)uVar2) >> 5) + uVar2;
                      if (newBound < 0x1000000) {
                        newBound = newBound * 0x100;
                        RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                      }
                      uVar7 = uVar10 * 2 + uVar7;
                      uVar10 = uVar8 >> 3 & 1;
                      uVar2 = _maxUnpackSize_local->posAlignEncoder[uVar7];
                      uVar11 = (newBound >> 0xb) * (uint)uVar2;
                      uVar8 = -uVar10;
                      uVar6 = uVar11 & uVar8;
                      (_maxUnpackSize_local->rc).low = (ulong)uVar6 + (_maxUnpackSize_local->rc).low
                      ;
                      uVar10 = uVar10 - 1;
                      newBound = (uVar11 & uVar10) + ((uVar8 & newBound) - uVar6);
                      _maxUnpackSize_local->posAlignEncoder[uVar7] =
                           (short)((int)(((uVar10 & 0x7e1) + 0x1f) - (uint)uVar2) >> 5) + uVar2;
                      if (newBound < 0x1000000) {
                        newBound = newBound * 0x100;
                        RangeEnc_ShiftLow(&_maxUnpackSize_local->rc);
                      }
                      (_maxUnpackSize_local->rc).range = newBound;
                    }
                  }
                }
              }
              _result_ = range + _result_;
              _maxUnpackSize_local->additionalOffset =
                   _maxUnpackSize_local->additionalOffset - range;
            } while (_maxUnpackSize_local->additionalOffset != 0);
            if (_maxUnpackSize_local->fastMode == 0) {
              if (0x3f < _maxUnpackSize_local->matchPriceCount) {
                FillAlignPrices(_maxUnpackSize_local);
                FillDistancesPrices(_maxUnpackSize_local);
                LenPriceEnc_UpdateTables
                          (&_maxUnpackSize_local->lenEnc,
                           1 << ((byte)_maxUnpackSize_local->pb & 0x1f),
                           &_maxUnpackSize_local->lenProbs,_maxUnpackSize_local->ProbPrices);
              }
              if (_maxUnpackSize_local->repLenEncCounter < 1) {
                _maxUnpackSize_local->repLenEncCounter = 0x40;
                LenPriceEnc_UpdateTables
                          (&_maxUnpackSize_local->repLenEnc,
                           1 << ((byte)_maxUnpackSize_local->pb & 0x1f),
                           &_maxUnpackSize_local->repLenProbs,_maxUnpackSize_local->ProbPrices);
              }
            }
            UVar4 = (*(_maxUnpackSize_local->matchFinder).GetNumAvailableBytes)
                              (_maxUnpackSize_local->matchFinderObj);
            if (UVar4 == 0) goto LAB_001d397a;
            if (nowPos32 == 0) break;
            if ((startPos32 <= (_result_ - numPairs) + 0x92c) ||
               ((Byte *)(ulong)nowPos32 <=
                (_maxUnpackSize_local->rc).buf +
                (_maxUnpackSize_local->rc).cacheSize +
                ((_maxUnpackSize_local->rc).processed - (long)(_maxUnpackSize_local->rc).bufBase) +
                0x4000)) goto LAB_001d397a;
          }
        } while (_result_ - numPairs < 0x20000);
        _maxUnpackSize_local->nowPos64 =
             (ulong)(_result_ - numPairs) + _maxUnpackSize_local->nowPos64;
        p_local._4_4_ = CheckErrors(_maxUnpackSize_local);
      }
    }
  }
  else {
    p_local._4_4_ = _maxUnpackSize_local->result;
  }
  return p_local._4_4_;
}

Assistant:

Z7_NO_INLINE
static SRes LzmaEnc_CodeOneBlock(CLzmaEnc *p, UInt32 maxPackSize, UInt32 maxUnpackSize)
{
  UInt32 nowPos32, startPos32;
  if (p->needInit)
  {
    #ifndef Z7_ST
    if (p->mtMode)
    {
      RINOK(MatchFinderMt_InitMt(&p->matchFinderMt))
    }
    #endif
    p->matchFinder.Init(p->matchFinderObj);
    p->needInit = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p))

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0)
  {
    unsigned numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit_0(&p->rc, &p->isMatch[kState_Start][0]);
    // p->state = kLiteralNextStates[p->state];
    curByte = *(p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
  
  for (;;)
  {
    UInt32 dist;
    unsigned len, posState;
    UInt32 range, ttt, newBound;
    CLzmaProb *probs;
  
    if (p->fastMode)
      len = GetOptimumFast(p);
    else
    {
      unsigned oci = p->optCur;
      if (p->optEnd == oci)
        len = GetOptimum(p, nowPos32);
      else
      {
        const COptimal *opt = &p->opt[oci];
        len = opt->len;
        p->backRes = opt->dist;
        p->optCur = oci + 1;
      }
    }

    posState = (unsigned)nowPos32 & p->pbMask;
    range = p->rc.range;
    probs = &p->isMatch[p->state][posState];
    
    RC_BIT_PRE(&p->rc, probs)
    
    dist = p->backRes;

    #ifdef SHOW_STAT2
    printf("\n pos = %6X, len = %3u  pos = %6u", nowPos32, len, dist);
    #endif

    if (dist == MARK_LIT)
    {
      Byte curByte;
      const Byte *data;
      unsigned state;

      RC_BIT_0(&p->rc, probs)
      p->rc.range = range;
      data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
      probs = LIT_PROBS(nowPos32, *(data - 1));
      curByte = *data;
      state = p->state;
      p->state = kLiteralNextStates[state];
      if (IsLitState(state))
        LitEnc_Encode(&p->rc, probs, curByte);
      else
        LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0]));
    }
    else
    {
      RC_BIT_1(&p->rc, probs)
      probs = &p->isRep[p->state];
      RC_BIT_PRE(&p->rc, probs)
      
      if (dist < LZMA_NUM_REPS)
      {
        RC_BIT_1(&p->rc, probs)
        probs = &p->isRepG0[p->state];
        RC_BIT_PRE(&p->rc, probs)
        if (dist == 0)
        {
          RC_BIT_0(&p->rc, probs)
          probs = &p->isRep0Long[p->state][posState];
          RC_BIT_PRE(&p->rc, probs)
          if (len != 1)
          {
            RC_BIT_1_BASE(&p->rc, probs)
          }
          else
          {
            RC_BIT_0_BASE(&p->rc, probs)
            p->state = kShortRepNextStates[p->state];
          }
        }
        else
        {
          RC_BIT_1(&p->rc, probs)
          probs = &p->isRepG1[p->state];
          RC_BIT_PRE(&p->rc, probs)
          if (dist == 1)
          {
            RC_BIT_0_BASE(&p->rc, probs)
            dist = p->reps[1];
          }
          else
          {
            RC_BIT_1(&p->rc, probs)
            probs = &p->isRepG2[p->state];
            RC_BIT_PRE(&p->rc, probs)
            if (dist == 2)
            {
              RC_BIT_0_BASE(&p->rc, probs)
              dist = p->reps[2];
            }
            else
            {
              RC_BIT_1_BASE(&p->rc, probs)
              dist = p->reps[3];
              p->reps[3] = p->reps[2];
            }
            p->reps[2] = p->reps[1];
          }
          p->reps[1] = p->reps[0];
          p->reps[0] = dist;
        }

        RC_NORM(&p->rc)

        p->rc.range = range;

        if (len != 1)
        {
          LenEnc_Encode(&p->repLenProbs, &p->rc, len - LZMA_MATCH_LEN_MIN, posState);
          --p->repLenEncCounter;
          p->state = kRepNextStates[p->state];
        }
      }
      else
      {
        unsigned posSlot;
        RC_BIT_0(&p->rc, probs)
        p->rc.range = range;
        p->state = kMatchNextStates[p->state];

        LenEnc_Encode(&p->lenProbs, &p->rc, len - LZMA_MATCH_LEN_MIN, posState);
        // --p->lenEnc.counter;

        dist -= LZMA_NUM_REPS;
        p->reps[3] = p->reps[2];
        p->reps[2] = p->reps[1];
        p->reps[1] = p->reps[0];
        p->reps[0] = dist + 1;
        
        p->matchPriceCount++;
        GetPosSlot(dist, posSlot)
        // RcTree_Encode_PosSlot(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], posSlot);
        {
          UInt32 sym = (UInt32)posSlot + (1 << kNumPosSlotBits);
          range = p->rc.range;
          probs = p->posSlotEncoder[GetLenToPosState(len)];
          do
          {
            CLzmaProb *prob = probs + (sym >> kNumPosSlotBits);
            UInt32 bit = (sym >> (kNumPosSlotBits - 1)) & 1;
            sym <<= 1;
            RC_BIT(&p->rc, prob, bit)
          }
          while (sym < (1 << kNumPosSlotBits * 2));
          p->rc.range = range;
        }
        
        if (dist >= kStartPosModelIndex)
        {
          unsigned footerBits = ((posSlot >> 1) - 1);

          if (dist < kNumFullDistances)
          {
            unsigned base = ((2 | (posSlot & 1)) << footerBits);
            RcTree_ReverseEncode(&p->rc, p->posEncoders + base, footerBits, (unsigned)(dist /* - base */));
          }
          else
          {
            UInt32 pos2 = (dist | 0xF) << (32 - footerBits);
            range = p->rc.range;
            // RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
            /*
            do
            {
              range >>= 1;
              p->rc.low += range & (0 - ((dist >> --footerBits) & 1));
              RC_NORM(&p->rc)
            }
            while (footerBits > kNumAlignBits);
            */
            do
            {
              range >>= 1;
              p->rc.low += range & (0 - (pos2 >> 31));
              pos2 += pos2;
              RC_NORM(&p->rc)
            }
            while (pos2 != 0xF0000000);


            // RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);

            {
              unsigned m = 1;
              unsigned bit;
              bit = dist & 1; dist >>= 1; RC_BIT(&p->rc, p->posAlignEncoder + m, bit)  m = (m << 1) + bit;
              bit = dist & 1; dist >>= 1; RC_BIT(&p->rc, p->posAlignEncoder + m, bit)  m = (m << 1) + bit;
              bit = dist & 1; dist >>= 1; RC_BIT(&p->rc, p->posAlignEncoder + m, bit)  m = (m << 1) + bit;
              bit = dist & 1;             RC_BIT(&p->rc, p->posAlignEncoder + m, bit)
              p->rc.range = range;
              // p->alignPriceCount++;
            }
          }
        }
      }
    }

    nowPos32 += (UInt32)len;
    p->additionalOffset -= len;
    
    if (p->additionalOffset == 0)
    {
      UInt32 processed;

      if (!p->fastMode)
      {
        /*
        if (p->alignPriceCount >= 16) // kAlignTableSize
          FillAlignPrices(p);
        if (p->matchPriceCount >= 128)
          FillDistancesPrices(p);
        if (p->lenEnc.counter <= 0)
          LenPriceEnc_UpdateTables(&p->lenEnc, 1 << p->pb, &p->lenProbs, p->ProbPrices);
        */
        if (p->matchPriceCount >= 64)
        {
          FillAlignPrices(p);
          // { int y; for (y = 0; y < 100; y++) {
          FillDistancesPrices(p);
          // }}
          LenPriceEnc_UpdateTables(&p->lenEnc, (unsigned)1 << p->pb, &p->lenProbs, p->ProbPrices);
        }
        if (p->repLenEncCounter <= 0)
        {
          p->repLenEncCounter = REP_LEN_COUNT;
          LenPriceEnc_UpdateTables(&p->repLenEnc, (unsigned)1 << p->pb, &p->repLenProbs, p->ProbPrices);
        }
      }
    
      if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
        break;
      processed = nowPos32 - startPos32;
      
      if (maxPackSize)
      {
        if (processed + kNumOpts + 300 >= maxUnpackSize
            || RangeEnc_GetProcessed_sizet(&p->rc) + kPackReserve >= maxPackSize)
          break;
      }
      else if (processed >= (1 << 17))
      {
        p->nowPos64 += nowPos32 - startPos32;
        return CheckErrors(p);
      }
    }
  }

  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}